

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

void gravity_function_array_dump(gravity_function_t *f,gravity_value_r r)

{
  gravity_class_t *pgVar1;
  gravity_object_t *pgVar2;
  uint32_t uVar3;
  char *local_80;
  char *local_70;
  gravity_map_t *map;
  size_t count;
  gravity_list_t *value;
  gravity_class_t *c;
  gravity_function_t *vf;
  gravity_value_t v;
  size_t i;
  size_t n;
  gravity_function_t *f_local;
  
  if (f->tag != EXEC_TYPE_NATIVE) {
    __assert_fail("f->tag == EXEC_TYPE_NATIVE",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                  ,0x244,"void gravity_function_array_dump(gravity_function_t *, gravity_value_r)");
  }
  v.field_1.n = 0;
  do {
    if (r.n <= v.field_1.p) {
      return;
    }
    pgVar1 = r.p[v.field_1.n].isa;
    pgVar2 = r.p[v.field_1.n].field_1.p;
    if ((pgVar1 == gravity_class_null) && (pgVar2 == (gravity_object_t *)0x0)) {
      printf("%05zu\tNULL\n",v.field_1.n);
    }
    else if ((pgVar1 == gravity_class_null) && (pgVar2 == (gravity_object_t *)0x1)) {
      printf("%05zu\tUNDEFINED\n",v.field_1.n);
    }
    else if (pgVar1 == gravity_class_bool) {
      printf("%05zu\tBOOL: %d\n",v.field_1.n,(ulong)(pgVar2 != (gravity_object_t *)0x0));
    }
    else if (pgVar1 == gravity_class_int) {
      printf("%05zu\tINT: %ld\n",v.field_1.n,pgVar2);
    }
    else if (pgVar1 == gravity_class_float) {
      printf("%05zu\tFLOAT: %g\n",pgVar2,v.field_1.n);
    }
    else if (pgVar1 == gravity_class_function) {
      if (pgVar2->identifier == (char *)0x0) {
        local_70 = "$anon";
      }
      else {
        local_70 = pgVar2->identifier;
      }
      printf("%05zu\tFUNC: %s\n",v.field_1.n,local_70);
    }
    else if (pgVar1 == gravity_class_class) {
      if (pgVar2->identifier == (char *)0x0) {
        local_80 = "$anon";
      }
      else {
        local_80 = pgVar2->identifier;
      }
      printf("%05zu\tCLASS: %s\n",v.field_1.n,local_80);
    }
    else if (pgVar1 == gravity_class_string) {
      printf("%05zu\tSTRING: %s\n",v.field_1.n,pgVar2->objclass);
    }
    else if (pgVar1 == gravity_class_list) {
      printf("%05zu\tLIST: %zu items\n",v.field_1.n,pgVar2->objclass);
    }
    else {
      if (pgVar1 != gravity_class_map) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                      ,0x284,
                      "void gravity_function_array_dump(gravity_function_t *, gravity_value_r)");
      }
      uVar3 = gravity_hash_count((gravity_hash_t *)pgVar2->objclass);
      printf("%05zu\tMAP: %u items\n",v.field_1.n,(ulong)uVar3);
    }
    v.field_1.p = (gravity_object_t *)((long)&(v.field_1.p)->isa + 1);
  } while( true );
}

Assistant:

static void gravity_function_array_dump (gravity_function_t *f, gravity_value_r r) {
    assert(f->tag == EXEC_TYPE_NATIVE);
    size_t n = marray_size(r);

    for (size_t i=0; i<n; i++) {
        gravity_value_t v = marray_get(r, i);

        if (VALUE_ISA_NULL(v)) {
            printf("%05zu\tNULL\n", i);
            continue;
        }
        
        if (VALUE_ISA_UNDEFINED(v)) {
            printf("%05zu\tUNDEFINED\n", i);
            continue;
        }
        
        if (VALUE_ISA_BOOL(v)) {
            printf("%05zu\tBOOL: %d\n", i, (v.n == 0) ? 0 : 1);
            continue;
        }
        
        if (VALUE_ISA_INT(v)) {
            printf("%05zu\tINT: %" PRId64 "\n", i, (int64_t)v.n);
            continue;
        }
        
        if (VALUE_ISA_FLOAT(v)) {
            printf("%05zu\tFLOAT: %g\n", i, (double)v.f);
            continue;
        }
        
        if (VALUE_ISA_FUNCTION(v)) {
            gravity_function_t *vf = VALUE_AS_FUNCTION(v);
            printf("%05zu\tFUNC: %s\n", i, (vf->identifier) ? vf->identifier : "$anon");
            continue;
        }
        
        if (VALUE_ISA_CLASS(v)) {
            gravity_class_t *c = VALUE_AS_CLASS(v);
            printf("%05zu\tCLASS: %s\n", i, (c->identifier) ? c->identifier: "$anon");
            continue;
            
        }
        
        if (VALUE_ISA_STRING(v)) {
            printf("%05zu\tSTRING: %s\n", i, VALUE_AS_CSTRING(v));
            continue;
        }
        
        if (VALUE_ISA_LIST(v)) {
            gravity_list_t *value = VALUE_AS_LIST(v);
            size_t count = marray_size(value->array);
            printf("%05zu\tLIST: %zu items\n", i, count);
            continue;
            
        }
        
        if (VALUE_ISA_MAP(v)) {
            gravity_map_t *map = VALUE_AS_MAP(v);
            printf("%05zu\tMAP: %u items\n", i, gravity_hash_count(map->hash));
            continue;
        }
        
        // should never reach this point
        assert(0);
    }
}